

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_io.c
# Opt level: O0

int KINSetMaxSubSetupCalls(void *kinmem,long msbsetsub)

{
  long in_RSI;
  KINMem in_RDI;
  KINMem kin_mem;
  int local_4;
  
  if (in_RDI == (KINMem)0x0) {
    KINProcessError((KINMem)0x0,-1,0x180,"KINSetMaxSubSetupCalls",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol_io.c"
                    ,"kinsol_mem = NULL illegal.");
    local_4 = -1;
  }
  else if (in_RSI < 0) {
    KINProcessError(in_RDI,-2,0x188,"KINSetMaxSubSetupCalls",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol_io.c"
                    ,"Illegal msbsetsub < 0.");
    local_4 = -2;
  }
  else {
    if (in_RSI == 0) {
      in_RDI->kin_msbset_sub = 5;
    }
    else {
      in_RDI->kin_msbset_sub = in_RSI;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int KINSetMaxSubSetupCalls(void* kinmem, long int msbsetsub)
{
  KINMem kin_mem;

  if (kinmem == NULL)
  {
    KINProcessError(NULL, KIN_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (KIN_MEM_NULL);
  }

  kin_mem = (KINMem)kinmem;

  if (msbsetsub < 0)
  {
    KINProcessError(kin_mem, KIN_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_BAD_MSBSETSUB);
    return (KIN_ILL_INPUT);
  }

  if (msbsetsub == 0) { kin_mem->kin_msbset_sub = MSBSET_SUB_DEFAULT; }
  else { kin_mem->kin_msbset_sub = msbsetsub; }

  return (KIN_SUCCESS);
}